

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O2

void gpc_b16g(Pixel *out,Pixel *in,Background *back)

{
  byte bVar1;
  uint uVar2;
  double dVar3;
  
  if (in->a < 1) {
    uVar2 = back->ig;
  }
  else {
    dVar3 = (double)in->a / 65535.0;
    bVar1 = sRGB((1.0 - dVar3) * back->dg + (double)in->g * (dVar3 / 65535.0));
    uVar2 = (uint)bVar1;
  }
  out->b = uVar2;
  out->g = uVar2;
  out->r = uVar2;
  out->a = 0xff;
  return;
}

Assistant:

static void
gpc_b16g(Pixel *out, const Pixel *in, const Background *back)
{
   if (in->a <= 0)
      out->r = out->g = out->b = back->ig;

   else
   {
      double a = in->a/65535.;
      double a1 = 1-a;

      a /= 65535;
      out->r = out->g = out->b = sRGB(in->g * a + back->dg * a1);
   }

   out->a = 255;
}